

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O3

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
::clear(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
        *this)

{
  pointer_type pcVar1;
  ulong uVar2;
  
  buffer_t<char>::validate((buffer_t<char> *)this);
  pcVar1 = (this->buffer_).v2_.begin;
  if (pcVar1 != (pointer_type)0x0) {
    buffer_t<char>::validate((buffer_t<char> *)this);
    uVar2 = (long)(this->buffer_).v2_.end - (long)(this->buffer_).v2_.begin;
    if (uVar2 == 0) {
      std::terminate();
    }
    operator_delete(pcVar1,uVar2);
    (this->buffer_).v2_.begin = (pointer_type)0x0;
    (this->buffer_).v2_.last = (pointer_type)0x0;
    (this->buffer_).v2_.end = (pointer_type)0x0;
  }
  buffer_t<char>::validate((buffer_t<char> *)this);
  return;
}

Assistant:

void clear() noexcept {
        validate_pointer_invariants();
        if (buff().begin) {
            deallocate_buffer(buff().begin, total_capacity());
            buff().clear();
        }
        validate_pointer_invariants();
    }